

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix_t Inv4(Matrix_t sMatrix)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  Matrix_t MVar5;
  
  MVar5 = Companion_Mat4(sMatrix);
  pfVar1 = MVar5.pMatrix;
  fVar4 = Det4(sMatrix);
  if (sMatrix._8_2_ == 0x404) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        pfVar1[lVar3] = pfVar1[lVar3] / fVar4;
      }
      pfVar1 = pfVar1 + 4;
    }
  }
  else {
    puts("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!");
    MVar5 = (Matrix_t)ZEXT816(0);
  }
  return MVar5;
}

Assistant:

Matrix_t Inv4(Matrix_t sMatrix)
{
	Matrix_t cp_mat;
	Matrix_t mat_err = {NULL, 0, 0};
	float det;
	int x, y;
	cp_mat = Companion_Mat4(sMatrix);			 //求伴随矩阵
	det = Det4(sMatrix);						 //求矩阵行列式
	if (sMatrix.row == 4 && sMatrix.column == 4) //(A^-1) = 1/|A|*(A*)
	{
		for (x = 0; x < 4; x++)
		{
			for (y = 0; y < 4; y++)
			{
				*(cp_mat.pMatrix + x * 4 + y) /= det;
			}
		}
		return cp_mat;
	}
	else
	{
		printf("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}